

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_find_file_extension(char *name)

{
  int iVar1;
  size_t sVar2;
  char *local_78;
  char *elist [4];
  char local_50 [8];
  char extgz [4];
  char extnia [8];
  char extimg [8];
  char exthdr [8];
  char extnii [8];
  int len;
  char extcopy [8];
  char *ext;
  char *name_local;
  
  builtin_strncpy(exthdr,".nii",5);
  exthdr[5] = '\0';
  exthdr[6] = '\0';
  exthdr[7] = '\0';
  builtin_strncpy(extimg,".hdr",5);
  extimg[5] = '\0';
  extimg[6] = '\0';
  extimg[7] = '\0';
  builtin_strncpy(extnia,".img",5);
  extnia[5] = '\0';
  extnia[6] = '\0';
  extnia[7] = '\0';
  stack0xffffffffffffffb4 = 0x61696e2e;
  local_50[0] = '.';
  local_50[1] = 'g';
  local_50[2] = 'z';
  local_50[3] = '\0';
  memset(&local_78,0,0x20);
  local_78 = exthdr;
  elist[0] = extimg;
  elist[1] = extnia;
  elist[2] = local_50 + 4;
  if (name == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(name);
    extnii._0_4_ = (undefined4)sVar2;
    if ((int)extnii._0_4_ < 4) {
      name_local = (char *)0x0;
    }
    else {
      name_local = name + (long)(int)extnii._0_4_ + -4;
      strcpy(extnii + 4,name_local);
      if (g_opts.allow_upper_fext != 0) {
        make_lowercase(extnii + 4);
      }
      iVar1 = compare_strlist(extnii + 4,&local_78,4);
      if (iVar1 < 0) {
        if ((int)extnii._0_4_ < 7) {
          name_local = (char *)0x0;
        }
        else {
          name_local = name + (long)(int)extnii._0_4_ + -7;
          strcpy(extnii + 4,name_local);
          if (g_opts.allow_upper_fext != 0) {
            make_lowercase(extnii + 4);
          }
          strcat(local_78,local_50);
          strcat(elist[0],local_50);
          strcat(elist[1],local_50);
          iVar1 = compare_strlist(extnii + 4,&local_78,3);
          if (iVar1 < 0) {
            if (1 < g_opts.debug) {
              fprintf(_stderr,"** find_file_ext: failed for name \'%s\'\n",name);
            }
            name_local = (char *)0x0;
          }
          else {
            iVar1 = is_mixedcase(name_local);
            if (iVar1 != 0) {
              fprintf(_stderr,"** mixed case extension \'%s\' is not valid\n",name_local);
              name_local = (char *)0x0;
            }
          }
        }
      }
      else {
        iVar1 = is_mixedcase(name_local);
        if (iVar1 != 0) {
          fprintf(_stderr,"** mixed case extension \'%s\' is not valid\n",name_local);
          name_local = (char *)0x0;
        }
      }
    }
  }
  return name_local;
}

Assistant:

char * nifti_find_file_extension( const char * name )
{
   const char * ext;
   char extcopy[8];
   int    len;
   char   extnii[8] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[8] = ".hdr";   /* (leave space for .gz) */
   char   extimg[8] = ".img";
   char   extnia[8] = ".nia";
   char   extgz[4]  = ".gz";
   char * elist[4]  = { NULL, NULL, NULL, NULL};

   /* stupid compiler... */
   elist[0] = extnii; elist[1] = exthdr; elist[2] = extimg; elist[3] = extnia;

   if ( ! name ) return NULL;

   len = (int)strlen(name);
   if ( len < 4 ) return NULL;

   ext = name + len - 4;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* if it look like a basic extension, fail or return it */
   if( compare_strlist(extcopy, elist, 4) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#ifdef HAVE_ZLIB
   if ( len < 7 ) return NULL;

   ext = name + len - 7;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* go after .gz extensions using the modifiable strings */
   strcat(elist[0], extgz); strcat(elist[1], extgz); strcat(elist[2], extgz);

   if( compare_strlist(extcopy, elist, 3) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#endif

   if( g_opts.debug > 1 )
      fprintf(stderr,"** find_file_ext: failed for name '%s'\n", name);

   return NULL;
}